

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O2

void av1_cyclic_refresh_setup(AV1_COMP *cpi)

{
  segmentation *seg;
  FRAME_TYPE frame_type;
  char cVar1;
  aom_enc_pass aVar2;
  int iVar3;
  CYCLIC_REFRESH *pCVar4;
  RefCntBuffer *pRVar5;
  uint8_t *__s;
  uchar *puVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uchar *puVar13;
  int iVar14;
  int iVar15;
  uint8_t *__s_00;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  CYCLIC_REFRESH *cr;
  ulong uVar24;
  uint64_t uVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  ulong local_88;
  
  pCVar4 = cpi->cyclic_refresh;
  iVar8 = (cpi->rc).high_source_sad;
  iVar10 = (cpi->ppi->p_rc).gfu_boost;
  iVar3 = 0xf;
  if (iVar10 < 0x640) {
    iVar3 = iVar10 / 100;
  }
  iVar10 = (cpi->ppi->gf_group).layer_depth[cpi->gf_frame_index];
  iVar11 = 6;
  if (iVar10 < 6) {
    iVar11 = iVar10;
  }
  frame_type = (cpi->common).current_frame.frame_type;
  if ((((((cpi->rc).rtc_external_ratectrl == 0) &&
        (pRVar5 = (cpi->common).prev_frame, pRVar5 != (RefCntBuffer *)0x0)) &&
       ((cpi->svc).number_spatial_layers == 1)) &&
      (((cpi->common).width != pRVar5->width || ((cpi->common).height != pRVar5->height)))) &&
     ((cpi->svc).temporal_layer_id == 0)) {
    memset(pCVar4->map,0,
           (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
    pCVar4->sb_index = 0;
    pCVar4->last_sb_index = 0;
    (cpi->refresh_frame).golden_frame = true;
    pCVar4->apply_cyclic_refresh = 0;
    pCVar4->counter_encode_maxq_scene_change = 0;
    pCVar4->percent_refresh_adjustment = 5;
    pCVar4->rate_ratio_qdelta_adjustment = 0.25;
  }
  seg = &(cpi->common).seg;
  if (pCVar4->apply_cyclic_refresh == 0) {
    if (((cpi->active_map).enabled == 0) || ((cpi->rc).percent_blocks_inactive == 100)) {
      memset((cpi->enc_seg).map,0,
             (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
      av1_disable_segmentation(seg);
    }
    if (((((cpi->common).current_frame.frame_type & 0xfd) == 0) || (iVar8 != 0)) ||
       ((cpi->ppi->rtc_ref).bias_recovery_frame == true)) {
      pCVar4->sb_index = 0;
      pCVar4->last_sb_index = 0;
      pCVar4->counter_encode_maxq_scene_change = 0;
      pCVar4->actual_num_seg1_blocks = 0;
      pCVar4->actual_num_seg2_blocks = 0;
    }
  }
  else {
    pCVar4->counter_encode_maxq_scene_change = pCVar4->counter_encode_maxq_scene_change + 1;
    dVar27 = av1_convert_qindex_to_q
                       ((cpi->common).quant_params.base_qindex,((cpi->common).seq_params)->bit_depth
                       );
    pCVar4->thresh_rate_sb = (long)(cpi->rc).sb64_target_rate << 10;
    pCVar4->thresh_dist_sb = (long)(dVar27 * dVar27) << 2;
    if (((cpi->oxcf).speed < 8) || ((cpi->common).height * (cpi->common).width < 0x38400)) {
      pCVar4->thresh_dist_sb = 0;
      pCVar4->thresh_rate_sb = 0x7fffffffffffffff;
    }
    av1_enable_segmentation(seg);
    if ((cpi->active_map).enabled == 0) {
      av1_clearall_segfeatures(seg);
    }
    av1_disable_segfeature(seg,0,'\0');
    uVar23 = 1;
    av1_enable_segfeature(seg,1,'\0');
    av1_enable_segfeature(seg,2,'\0');
    iVar8 = compute_deltaq(cpi,(cpi->common).quant_params.base_qindex,pCVar4->rate_ratio_qdelta);
    pCVar4->qindex_delta[1] = iVar8;
    uVar9 = iVar8 + (cpi->common).quant_params.base_qindex + (cpi->common).quant_params.y_dc_delta_q
    ;
    uVar22 = 0xff;
    if (uVar9 < 0xff) {
      uVar22 = uVar9;
    }
    if ((int)uVar9 < 0) {
      uVar22 = 0;
    }
    aVar2 = (cpi->oxcf).pass;
    if (aVar2 < AOM_RC_LAST_PASS) {
      if (aVar2 == AOM_RC_ONE_PASS) {
        uVar23 = 0;
        if (cpi->compressor_stage == '\0') {
          uVar23 = (uint)(cpi->ppi->lap_enabled != 0);
        }
      }
      else {
        uVar23 = 0;
      }
    }
    iVar10 = av1_compute_rd_mult(uVar22,((cpi->common).seq_params)->bit_depth,
                                 (cpi->ppi->gf_group).update_type[cpi->gf_frame_index],iVar11,iVar3,
                                 frame_type,(cpi->oxcf).q_cfg.use_fixed_qp_offsets,uVar23,
                                 (cpi->oxcf).tune_cfg.tuning);
    pCVar4->rdmult = iVar10;
    av1_set_segdata(seg,1,'\0',iVar8);
    dVar28 = (double)pCVar4->rate_boost_fac * 0.1 * pCVar4->rate_ratio_qdelta;
    dVar27 = 4.0;
    if (dVar28 <= 4.0) {
      dVar27 = dVar28;
    }
    iVar8 = compute_deltaq(cpi,(cpi->common).quant_params.base_qindex,dVar27);
    pCVar4->qindex_delta[2] = iVar8;
    av1_set_segdata(seg,2,'\0',iVar8);
    pCVar4 = cpi->cyclic_refresh;
    __s = (cpi->enc_seg).map;
    puVar6 = (cpi->active_map).map;
    iVar8 = (cpi->common).mi_params.mi_rows;
    iVar10 = (cpi->common).mi_params.mi_cols;
    if ((cpi->active_map).enabled == 0) {
      memset(__s,0,(long)(iVar10 * iVar8));
    }
    iVar3 = ((cpi->common).seq_params)->mib_size;
    iVar16 = (iVar10 + iVar3 + -1) / iVar3;
    iVar14 = ((iVar3 + iVar8 + -1) / iVar3) * iVar16;
    iVar3 = pCVar4->percent_refresh;
    iVar11 = pCVar4->sb_index;
    if (iVar14 <= iVar11) {
      pCVar4->sb_index = 0;
      iVar11 = 0;
    }
    pCVar4->last_sb_index = iVar11;
    pCVar4->target_num_seg_blocks = 0;
    lVar7 = (long)iVar10 * 2;
    uVar24 = 0;
    uVar25 = 0;
    local_88 = 0x7fffffffffffffff;
    do {
      uVar23 = ((cpi->common).seq_params)->mib_size;
      iVar12 = (iVar11 / iVar16) * uVar23;
      iVar15 = (iVar11 % iVar16) * uVar23;
      uVar22 = iVar10 - iVar15;
      if ((int)uVar23 <= (int)uVar22) {
        uVar22 = uVar23;
      }
      uVar9 = iVar8 - iVar12;
      if ((int)uVar23 <= (int)uVar9) {
        uVar9 = uVar23;
      }
      uVar17 = (ulong)uVar9;
      if (((pCVar4->use_block_sad_scene_det != 0) && (0x1e < (cpi->rc).frames_since_key)) &&
         ((0x1e < pCVar4->counter_encode_maxq_scene_change &&
          ((cpi->src_sad_blk_64x64 != (uint64_t *)0x0 &&
           ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)))))) {
        uVar25 = cpi->src_sad_blk_64x64[iVar11];
        local_88 = (ulong)(0x383ff < (cpi->common).height * (cpi->common).width) * 0x2000 + 0x6000;
        uVar24 = 0x2000;
        if ((1 < (cpi->svc).number_temporal_layers) && ((cpi->svc).temporal_layer_id == 0)) {
          uVar24 = 0x8000;
          local_88 = (ulong)(uint)((int)local_88 << 4);
        }
      }
      lVar19 = (long)(iVar12 * iVar10 + iVar15);
      puVar13 = puVar6 + lVar19;
      iVar12 = 0;
      lVar20 = lVar19;
      for (lVar18 = 0; lVar18 < (int)uVar9; lVar18 = lVar18 + 2) {
        for (lVar21 = 0; lVar21 < (int)uVar22; lVar21 = lVar21 + 2) {
          cVar1 = pCVar4->map[lVar21 + lVar20];
          if (((cVar1 == '\0') || (uVar25 < uVar24)) &&
             (((cpi->active_map).enabled == 0 || (puVar13[lVar21] == '\0')))) {
            iVar12 = iVar12 + 4;
          }
          else if (cVar1 < '\0') {
            pCVar4->map[lVar21 + lVar20] = cVar1 + '\x01';
          }
        }
        puVar13 = puVar13 + lVar7;
        lVar20 = lVar20 + lVar7;
      }
      if ((iVar12 < (int)(uVar22 * uVar9) >> 1) || (local_88 <= uVar25)) {
        iVar12 = pCVar4->target_num_seg_blocks;
      }
      else {
        __s_00 = __s + lVar19;
        if ((int)uVar9 < 1) {
          uVar17 = 0;
        }
        while (bVar26 = uVar17 != 0, uVar17 = uVar17 - 1, bVar26) {
          memset(__s_00,1,(long)(int)uVar22);
          __s_00 = __s_00 + iVar10;
        }
        iVar12 = uVar22 * uVar9 + pCVar4->target_num_seg_blocks;
        pCVar4->target_num_seg_blocks = iVar12;
      }
      iVar11 = iVar11 + 1;
      if (iVar11 == iVar14) {
        iVar11 = 0;
      }
    } while ((iVar12 < (iVar10 * iVar8 * iVar3) / 100) && (iVar11 != pCVar4->sb_index));
    pCVar4->sb_index = iVar11;
    if ((iVar12 == 0) && ((cpi->active_map).enabled == 0)) {
      av1_disable_segmentation(seg);
      return;
    }
  }
  return;
}

Assistant:

void av1_cyclic_refresh_setup(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  struct segmentation *const seg = &cm->seg;
  const int scene_change_detected = is_scene_change_detected(cpi);
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  // Set resolution_change flag: for single spatial layers only.
  const int resolution_change = !cpi->rc.rtc_external_ratectrl &&
                                cm->prev_frame &&
                                cpi->svc.number_spatial_layers == 1 &&
                                (cm->width != cm->prev_frame->width ||
                                 cm->height != cm->prev_frame->height);

  if (resolution_change && cpi->svc.temporal_layer_id == 0)
    cyclic_refresh_reset_resize(cpi);
  if (!cr->apply_cyclic_refresh) {
    // Don't disable and set seg_map to 0 if active_maps is enabled, unless
    // whole frame is set as inactive (since we only apply cyclic_refresh to
    // active blocks).
    if (!cpi->active_map.enabled || cpi->rc.percent_blocks_inactive == 100) {
      unsigned char *const seg_map = cpi->enc_seg.map;
      memset(seg_map, 0, cm->mi_params.mi_rows * cm->mi_params.mi_cols);
      av1_disable_segmentation(&cm->seg);
    }
    if (frame_is_intra_only(cm) || scene_change_detected ||
        cpi->ppi->rtc_ref.bias_recovery_frame) {
      cr->sb_index = 0;
      cr->last_sb_index = 0;
      cr->counter_encode_maxq_scene_change = 0;
      cr->actual_num_seg1_blocks = 0;
      cr->actual_num_seg2_blocks = 0;
    }
    return;
  } else {
    cr->counter_encode_maxq_scene_change++;
    const double q = av1_convert_qindex_to_q(cm->quant_params.base_qindex,
                                             cm->seq_params->bit_depth);
    // Set rate threshold to some multiple (set to 2 for now) of the target
    // rate (target is given by sb64_target_rate and scaled by 256).
    cr->thresh_rate_sb = ((int64_t)(rc->sb64_target_rate) << 8) << 2;
    // Distortion threshold, quadratic in Q, scale factor to be adjusted.
    // q will not exceed 457, so (q * q) is within 32bit; see:
    // av1_convert_qindex_to_q(), av1_ac_quant(), ac_qlookup*[].
    cr->thresh_dist_sb = ((int64_t)(q * q)) << 2;
    // For low-resoln or lower speeds, the rate/dist thresholds need to be
    // tuned/updated.
    if (cpi->oxcf.speed <= 7 || (cm->width * cm->height < 640 * 360)) {
      cr->thresh_dist_sb = 0;
      cr->thresh_rate_sb = INT64_MAX;
    }
    // Set up segmentation.
    av1_enable_segmentation(&cm->seg);
    if (!cpi->active_map.enabled) {
      // Clear down the segment map, only if active_maps is not enabled.
      av1_clearall_segfeatures(seg);
    }

    // Note: setting temporal_update has no effect, as the seg-map coding method
    // (temporal or spatial) is determined in
    // av1_choose_segmap_coding_method(),
    // based on the coding cost of each method. For error_resilient mode on the
    // last_frame_seg_map is set to 0, so if temporal coding is used, it is
    // relative to 0 previous map.
    // seg->temporal_update = 0;

    // Segment BASE "Q" feature is disabled so it defaults to the baseline Q.
    av1_disable_segfeature(seg, CR_SEGMENT_ID_BASE, SEG_LVL_ALT_Q);
    // Use segment BOOST1 for in-frame Q adjustment.
    av1_enable_segfeature(seg, CR_SEGMENT_ID_BOOST1, SEG_LVL_ALT_Q);
    // Use segment BOOST2 for more aggressive in-frame Q adjustment.
    av1_enable_segfeature(seg, CR_SEGMENT_ID_BOOST2, SEG_LVL_ALT_Q);

    // Set the q delta for segment BOOST1.
    const CommonQuantParams *const quant_params = &cm->quant_params;
    int qindex_delta =
        compute_deltaq(cpi, quant_params->base_qindex, cr->rate_ratio_qdelta);
    cr->qindex_delta[1] = qindex_delta;

    // Compute rd-mult for segment BOOST1.
    const int qindex2 = clamp(
        quant_params->base_qindex + quant_params->y_dc_delta_q + qindex_delta,
        0, MAXQ);
    cr->rdmult = av1_compute_rd_mult(
        qindex2, cm->seq_params->bit_depth,
        cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
        boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
        is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

    av1_set_segdata(seg, CR_SEGMENT_ID_BOOST1, SEG_LVL_ALT_Q, qindex_delta);

    // Set a more aggressive (higher) q delta for segment BOOST2.
    qindex_delta = compute_deltaq(
        cpi, quant_params->base_qindex,
        AOMMIN(CR_MAX_RATE_TARGET_RATIO,
               0.1 * cr->rate_boost_fac * cr->rate_ratio_qdelta));
    cr->qindex_delta[2] = qindex_delta;
    av1_set_segdata(seg, CR_SEGMENT_ID_BOOST2, SEG_LVL_ALT_Q, qindex_delta);

    // Update the segmentation and refresh map.
    cyclic_refresh_update_map(cpi);
  }
}